

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 VmLocalExec(jx9_vm *pVm,SySet *pByteCode,jx9_value *pResult)

{
  jx9_value *pStack_00;
  sxi32 rc;
  jx9_value *pStack;
  jx9_value *pResult_local;
  SySet *pByteCode_local;
  jx9_vm *pVm_local;
  
  pStack_00 = VmNewOperandStack(pVm,pByteCode->nUsed);
  if (pStack_00 == (jx9_value *)0x0) {
    pVm_local._4_4_ = -1;
  }
  else {
    pVm_local._4_4_ = VmByteCodeExec(pVm,(VmInstr *)pByteCode->pBase,pStack_00,-1,pResult);
    SyMemBackendFree(&pVm->sAllocator,pStack_00);
  }
  return pVm_local._4_4_;
}

Assistant:

static sxi32 VmLocalExec(jx9_vm *pVm, SySet *pByteCode,jx9_value *pResult)
{
	jx9_value *pStack;
	sxi32 rc;
	/* Allocate a new operand stack */
	pStack = VmNewOperandStack(&(*pVm), SySetUsed(pByteCode));
	if( pStack == 0 ){
		return SXERR_MEM;
	}
	/* Execute the program */
	rc = VmByteCodeExec(&(*pVm), (VmInstr *)SySetBasePtr(pByteCode), pStack, -1, &(*pResult));
	/* Free the operand stack */
	SyMemBackendFree(&pVm->sAllocator, pStack);
	/* Execution result */
	return rc;
}